

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

longlong mkvparser::ReadID(IMkvReader *pReader,longlong pos,long *len)

{
  longlong lVar1;
  int iVar2;
  ulong in_RAX;
  long lVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  bool bVar7;
  longlong lStack_40;
  ulong uStack_38;
  uchar temp_byte;
  
  if (pos < 0 || pReader == (IMkvReader *)0x0) {
LAB_001228f9:
    lStack_40 = -2;
  }
  else {
    uStack_38 = in_RAX & 0xffffffffffffff;
    iVar2 = (**pReader->_vptr_IMkvReader)(pReader,pos,1);
    lVar1 = -2;
    lStack_40 = lVar1;
    if (((-1 < iVar2) && (lStack_40 = -3, iVar2 == 0)) && (lStack_40 = lVar1, temp_byte != '\0')) {
      lVar4 = 0;
LAB_00122946:
      if ((int)lVar4 != 4) {
        if (-1 < (char)(temp_byte << ((byte)lVar4 & 0x1f))) goto code_r0x00122957;
        uVar5 = (ulong)temp_byte;
        lVar6 = pos + 1;
        lVar3 = lVar4;
        while( true ) {
          bVar7 = lVar3 == 0;
          lVar3 = lVar3 + -1;
          if (bVar7) {
            *len = lVar4 + 1;
            return uVar5;
          }
          iVar2 = (**pReader->_vptr_IMkvReader)(pReader,lVar6,1,&temp_byte);
          if (iVar2 < 0) break;
          if (iVar2 != 0) {
            return -3;
          }
          uVar5 = uVar5 << 8 | uStack_38 >> 0x38;
          lVar6 = lVar6 + 1;
        }
        goto LAB_001228f9;
      }
    }
  }
  return lStack_40;
code_r0x00122957:
  lVar4 = lVar4 + 1;
  goto LAB_00122946;
}

Assistant:

long long ReadID(IMkvReader* pReader, long long pos, long& len) {
  if (pReader == NULL || pos < 0)
    return E_FILE_FORMAT_INVALID;

  // Read the first byte. The length in bytes of the ID is determined by
  // finding the first set bit in the first byte of the ID.
  unsigned char temp_byte = 0;
  int read_status = pReader->Read(pos, 1, &temp_byte);

  if (read_status < 0)
    return E_FILE_FORMAT_INVALID;
  else if (read_status > 0)  // No data to read.
    return E_BUFFER_NOT_FULL;

  if (temp_byte == 0)  // ID length > 8 bytes; invalid file.
    return E_FILE_FORMAT_INVALID;

  int bit_pos = 0;
  const int kMaxIdLengthInBytes = 4;
  const int kCheckByte = 0x80;

  // Find the first bit that's set.
  bool found_bit = false;
  for (; bit_pos < kMaxIdLengthInBytes; ++bit_pos) {
    if ((kCheckByte >> bit_pos) & temp_byte) {
      found_bit = true;
      break;
    }
  }

  if (!found_bit) {
    // The value is too large to be a valid ID.
    return E_FILE_FORMAT_INVALID;
  }

  // Read the remaining bytes of the ID (if any).
  const int id_length = bit_pos + 1;
  long long ebml_id = temp_byte;
  for (int i = 1; i < id_length; ++i) {
    ebml_id <<= 8;
    read_status = pReader->Read(pos + i, 1, &temp_byte);

    if (read_status < 0)
      return E_FILE_FORMAT_INVALID;
    else if (read_status > 0)
      return E_BUFFER_NOT_FULL;

    ebml_id |= temp_byte;
  }

  len = id_length;
  return ebml_id;
}